

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

int __thiscall
AddrInfo::GetNewBucket(AddrInfo *this,uint256 *nKey,CNetAddr *src,NetGroupManager *netgroupman)

{
  undefined8 uVar1;
  HashWriter *pHVar2;
  CSHA256 *this_00;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSourceGroupKey;
  uint256 result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  CSHA256 local_a8;
  uint256 local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  NetGroupManager::GetGroup(&local_c0,netgroupman,src);
  local_a8.buf[0x30] = '\0';
  local_a8.buf[0x31] = '\0';
  local_a8.buf[0x32] = '\0';
  local_a8.buf[0x33] = '\0';
  local_a8.buf[0x34] = '\0';
  local_a8.buf[0x35] = '\0';
  local_a8.buf[0x36] = '\0';
  local_a8.buf[0x37] = '\0';
  local_a8.buf[0x38] = '\0';
  local_a8.buf[0x39] = '\0';
  local_a8.buf[0x3a] = '\0';
  local_a8.buf[0x3b] = '\0';
  local_a8.buf[0x3c] = '\0';
  local_a8.buf[0x3d] = '\0';
  local_a8.buf[0x3e] = '\0';
  local_a8.buf[0x3f] = '\0';
  local_a8.buf[0x20] = '\0';
  local_a8.buf[0x21] = '\0';
  local_a8.buf[0x22] = '\0';
  local_a8.buf[0x23] = '\0';
  local_a8.buf[0x24] = '\0';
  local_a8.buf[0x25] = '\0';
  local_a8.buf[0x26] = '\0';
  local_a8.buf[0x27] = '\0';
  local_a8.buf[0x28] = '\0';
  local_a8.buf[0x29] = '\0';
  local_a8.buf[0x2a] = '\0';
  local_a8.buf[0x2b] = '\0';
  local_a8.buf[0x2c] = '\0';
  local_a8.buf[0x2d] = '\0';
  local_a8.buf[0x2e] = '\0';
  local_a8.buf[0x2f] = '\0';
  local_a8.buf[0x10] = '\0';
  local_a8.buf[0x11] = '\0';
  local_a8.buf[0x12] = '\0';
  local_a8.buf[0x13] = '\0';
  local_a8.buf[0x14] = '\0';
  local_a8.buf[0x15] = '\0';
  local_a8.buf[0x16] = '\0';
  local_a8.buf[0x17] = '\0';
  local_a8.buf[0x18] = '\0';
  local_a8.buf[0x19] = '\0';
  local_a8.buf[0x1a] = '\0';
  local_a8.buf[0x1b] = '\0';
  local_a8.buf[0x1c] = '\0';
  local_a8.buf[0x1d] = '\0';
  local_a8.buf[0x1e] = '\0';
  local_a8.buf[0x1f] = '\0';
  local_a8.buf[0] = '\0';
  local_a8.buf[1] = '\0';
  local_a8.buf[2] = '\0';
  local_a8.buf[3] = '\0';
  local_a8.buf[4] = '\0';
  local_a8.buf[5] = '\0';
  local_a8.buf[6] = '\0';
  local_a8.buf[7] = '\0';
  local_a8.buf[8] = '\0';
  local_a8.buf[9] = '\0';
  local_a8.buf[10] = '\0';
  local_a8.buf[0xb] = '\0';
  local_a8.buf[0xc] = '\0';
  local_a8.buf[0xd] = '\0';
  local_a8.buf[0xe] = '\0';
  local_a8.buf[0xf] = '\0';
  local_a8.s[4] = 0;
  local_a8.s[5] = 0;
  local_a8.s[6] = 0;
  local_a8.s[7] = 0;
  local_a8.s[0] = 0;
  local_a8.s[1] = 0;
  local_a8.s[2] = 0;
  local_a8.s[3] = 0;
  local_a8.bytes = 0;
  CSHA256::CSHA256(&local_a8);
  CSHA256::Write(&local_a8,(uchar *)nKey,0x20);
  NetGroupManager::GetGroup(&local_d8,netgroupman,(CNetAddr *)this);
  pHVar2 = HashWriter::operator<<((HashWriter *)&local_a8,&local_d8);
  pHVar2 = HashWriter::operator<<(pHVar2,&local_c0);
  HashWriter::GetHash(&local_40,pHVar2);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a8.buf[0x30] = '\0';
  local_a8.buf[0x31] = '\0';
  local_a8.buf[0x32] = '\0';
  local_a8.buf[0x33] = '\0';
  local_a8.buf[0x34] = '\0';
  local_a8.buf[0x35] = '\0';
  local_a8.buf[0x36] = '\0';
  local_a8.buf[0x37] = '\0';
  local_a8.buf[0x38] = '\0';
  local_a8.buf[0x39] = '\0';
  local_a8.buf[0x3a] = '\0';
  local_a8.buf[0x3b] = '\0';
  local_a8.buf[0x3c] = '\0';
  local_a8.buf[0x3d] = '\0';
  local_a8.buf[0x3e] = '\0';
  local_a8.buf[0x3f] = '\0';
  local_a8.buf[0x20] = '\0';
  local_a8.buf[0x21] = '\0';
  local_a8.buf[0x22] = '\0';
  local_a8.buf[0x23] = '\0';
  local_a8.buf[0x24] = '\0';
  local_a8.buf[0x25] = '\0';
  local_a8.buf[0x26] = '\0';
  local_a8.buf[0x27] = '\0';
  local_a8.buf[0x28] = '\0';
  local_a8.buf[0x29] = '\0';
  local_a8.buf[0x2a] = '\0';
  local_a8.buf[0x2b] = '\0';
  local_a8.buf[0x2c] = '\0';
  local_a8.buf[0x2d] = '\0';
  local_a8.buf[0x2e] = '\0';
  local_a8.buf[0x2f] = '\0';
  local_a8.buf[0x10] = '\0';
  local_a8.buf[0x11] = '\0';
  local_a8.buf[0x12] = '\0';
  local_a8.buf[0x13] = '\0';
  local_a8.buf[0x14] = '\0';
  local_a8.buf[0x15] = '\0';
  local_a8.buf[0x16] = '\0';
  local_a8.buf[0x17] = '\0';
  local_a8.buf[0x18] = '\0';
  local_a8.buf[0x19] = '\0';
  local_a8.buf[0x1a] = '\0';
  local_a8.buf[0x1b] = '\0';
  local_a8.buf[0x1c] = '\0';
  local_a8.buf[0x1d] = '\0';
  local_a8.buf[0x1e] = '\0';
  local_a8.buf[0x1f] = '\0';
  local_a8.buf[0] = '\0';
  local_a8.buf[1] = '\0';
  local_a8.buf[2] = '\0';
  local_a8.buf[3] = '\0';
  local_a8.buf[4] = '\0';
  local_a8.buf[5] = '\0';
  local_a8.buf[6] = '\0';
  local_a8.buf[7] = '\0';
  local_a8.buf[8] = '\0';
  local_a8.buf[9] = '\0';
  local_a8.buf[10] = '\0';
  local_a8.buf[0xb] = '\0';
  local_a8.buf[0xc] = '\0';
  local_a8.buf[0xd] = '\0';
  local_a8.buf[0xe] = '\0';
  local_a8.buf[0xf] = '\0';
  local_a8.s[4] = 0;
  local_a8.s[5] = 0;
  local_a8.s[6] = 0;
  local_a8.s[7] = 0;
  local_a8.s[0] = 0;
  local_a8.s[1] = 0;
  local_a8.s[2] = 0;
  local_a8.s[3] = 0;
  local_a8.bytes = 0;
  CSHA256::CSHA256(&local_a8);
  CSHA256::Write(&local_a8,(uchar *)nKey,0x20);
  this_00 = &HashWriter::operator<<((HashWriter *)&local_a8,&local_c0)->ctx;
  local_40.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ZEXT48(local_40.super_base_blob<256U>.m_data._M_elems._0_4_ & 0x3f);
  CSHA256::Write(this_00,(uchar *)&local_40,8);
  HashWriter::GetHash(&local_40,(HashWriter *)this_00);
  uVar1 = local_40.super_base_blob<256U>.m_data._M_elems._0_8_;
  if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (uint)uVar1 & 0x3ff;
  }
  __stack_chk_fail();
}

Assistant:

int AddrInfo::GetNewBucket(const uint256& nKey, const CNetAddr& src, const NetGroupManager& netgroupman) const
{
    std::vector<unsigned char> vchSourceGroupKey = netgroupman.GetGroup(src);
    uint64_t hash1 = (HashWriter{} << nKey << netgroupman.GetGroup(*this) << vchSourceGroupKey).GetCheapHash();
    uint64_t hash2 = (HashWriter{} << nKey << vchSourceGroupKey << (hash1 % ADDRMAN_NEW_BUCKETS_PER_SOURCE_GROUP)).GetCheapHash();
    return hash2 % ADDRMAN_NEW_BUCKET_COUNT;
}